

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::cubeCornersMesh(Mesh *__return_storage_ptr__,vec3 *_min_v,vec3 *_max_v,float _size)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar6;
  vec3 H;
  vec3 I;
  vec3 D;
  vec3 C;
  vec3 A;
  vec3 G;
  vec3 F;
  vec3 B;
  vec3 local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c0;
  undefined1 local_1b8 [16];
  float local_1a0;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_19c;
  float local_198;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_194;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_190;
  float local_18c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_188;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_184;
  float local_180;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_17c;
  undefined1 local_178 [16];
  undefined8 local_168;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_11c;
  float local_118;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_114;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_110;
  float local_10c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_108;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_104;
  float local_100;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_fc;
  undefined1 local_f8 [16];
  Mesh local_e0;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  fVar1 = (_min_v->field_2).z * (_min_v->field_2).z +
          (_min_v->field_1).y * (_min_v->field_1).y + (_min_v->field_0).x * (_min_v->field_0).x;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = (_max_v->field_2).z * (_max_v->field_2).z +
          (_max_v->field_1).y * (_max_v->field_1).y + (_max_v->field_0).x * (_max_v->field_0).x;
  if (fVar2 < 0.0) {
    local_248._0_4_ = fVar1;
    fVar2 = sqrtf(fVar2);
    fVar1 = (float)local_248._0_4_;
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  fVar2 = fVar2 * _size * 0.5;
  local_194 = _max_v->field_2;
  local_168._0_4_ = _max_v->field_0;
  local_168._4_4_ = _max_v->field_1;
  local_1c0 = _min_v->field_2;
  local_1c8._0_4_ = _min_v->field_0;
  local_1c8._4_4_ = _min_v->field_1;
  local_1d8 = ZEXT416((uint)local_168._0_4_);
  local_138._0_4_ = local_168._4_4_;
  local_104 = local_168._0_4_;
  local_100 = local_168._4_4_;
  local_184 = local_1c8._0_4_;
  local_180 = local_168._4_4_;
  local_190 = local_1c8._0_4_;
  local_208._0_4_ = local_1c8._0_4_;
  local_18c = local_168._4_4_;
  local_228._0_4_ = local_194;
  local_110 = local_168._0_4_;
  local_10c = local_1c8._4_4_;
  local_11c = local_168._0_4_;
  local_118 = local_1c8._4_4_;
  local_248._0_4_ = local_1c0;
  local_19c = local_1c8._0_4_;
  local_178 = ZEXT416((uint)local_1c8._4_4_);
  local_198 = local_1c8._4_4_;
  local_188 = local_194;
  local_17c = local_1c0;
  local_160 = local_194;
  local_114 = local_1c0;
  local_108 = local_194;
  local_fc = local_1c0;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  fVar1 = (float)local_208._0_4_ - (float)local_1d8._0_4_;
  fVar3 = (float)local_138._0_4_ - (float)local_138._0_4_;
  local_148._0_4_ = (float)local_228._0_4_ - (float)local_228._0_4_;
  local_238 = ZEXT416((uint)fVar3);
  local_20c.z = (float)local_148._0_4_ * (float)local_148._0_4_;
  local_1f8._0_4_ = fVar3 * fVar3;
  local_38._0_4_ = fVar1 * fVar1 + fVar3 * fVar3;
  fVar3 = (float)local_38._0_4_ + local_20c.z;
  local_f8 = ZEXT416((uint)fVar1);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    fVar1 = (float)local_f8._0_4_;
    fVar4 = (float)local_148._0_4_;
  }
  else {
    fVar3 = SQRT(fVar3);
    fVar4 = (float)local_148._0_4_;
  }
  fVar3 = 1.0 / fVar3;
  local_258.field_2.z = fVar3 * fVar4;
  local_258.field_1.y = (float)local_238._0_4_ * fVar3;
  local_258.field_0.x = fVar1 * fVar3;
  lineToMesh(&local_e0,(vec3 *)&local_168,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_1e8._0_4_ = (float)local_1d8._0_4_ - (float)local_1d8._0_4_;
  fVar1 = (float)local_248._0_4_ - (float)local_228._0_4_;
  local_1e8._4_4_ = local_1d8._4_4_;
  local_1e8._8_4_ = local_1d8._8_4_;
  local_1e8._12_4_ = local_1d8._12_4_;
  local_1b8._0_4_ = (float)local_1e8._0_4_ * (float)local_1e8._0_4_;
  local_1a0 = (float)local_1b8._0_4_ + (float)local_1f8._0_4_;
  fVar3 = fVar1 * fVar1 + local_1a0;
  if (fVar3 < 0.0) {
    local_158._0_4_ = fVar1;
    fVar3 = sqrtf(fVar3);
    fVar1 = (float)local_158._0_4_;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  local_258.field_2.z = fVar1 * fVar3;
  local_258.field_1.y = (float)local_238._0_4_ * fVar3;
  local_258.field_0.x = (float)local_1e8._0_4_ * fVar3;
  lineToMesh(&local_e0,(vec3 *)&local_168,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_158._0_4_ = (float)local_178._0_4_ - (float)local_138._0_4_;
  local_1b8._0_4_ = (float)local_1b8._0_4_ + (float)local_158._0_4_ * (float)local_158._0_4_;
  fVar1 = local_20c.z + (float)local_1b8._0_4_;
  local_158._4_4_ = local_178._4_4_;
  local_158._8_4_ = local_178._8_4_;
  local_158._12_4_ = local_178._12_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
    fVar3 = (float)local_158._0_4_;
  }
  else {
    fVar1 = SQRT(fVar1);
    fVar3 = (float)local_158._0_4_;
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_148._0_4_ * fVar1;
  local_258.field_1.y = fVar3 * fVar1;
  local_258.field_0.x = (float)local_1e8._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_168,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_228._0_4_ - (float)local_248._0_4_;
  local_228._0_4_ = fVar1;
  fVar3 = local_1a0 + fVar1 * fVar1;
  local_148._0_4_ = fVar1 * fVar1;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  local_258.field_2.z = fVar3 * (float)local_228._0_4_;
  local_258.field_1.y = (float)local_238._0_4_ * fVar3;
  local_258.field_0.x = (float)local_1e8._0_4_ * fVar3;
  lineToMesh(&local_e0,(vec3 *)&local_104,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_248._0_4_ - (float)local_248._0_4_;
  local_248._0_4_ = fVar1;
  local_138._0_4_ = fVar1 * fVar1;
  fVar1 = (float)local_38._0_4_ + fVar1 * fVar1;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = fVar1 * (float)local_248._0_4_;
  local_258.field_1.y = (float)local_238._0_4_ * fVar1;
  local_258.field_0.x = (float)local_f8._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_104,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_1b8._0_4_ + (float)local_138._0_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = fVar1 * (float)local_248._0_4_;
  local_258.field_1.y = (float)local_158._0_4_ * fVar1;
  local_258.field_0.x = (float)local_1e8._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_104,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_208._0_4_ - (float)local_208._0_4_;
  fVar3 = fVar1 * fVar1 + (float)local_1f8._0_4_ + (float)local_148._0_4_;
  if (fVar3 < 0.0) {
    local_1e8 = ZEXT416((uint)fVar1);
    fVar3 = sqrtf(fVar3);
    fVar1 = (float)local_1e8._0_4_;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  local_258.field_2.z = (float)local_228._0_4_ * fVar3;
  local_258.field_1.y = (float)local_238._0_4_ * fVar3;
  local_258.field_0.x = fVar1 * fVar3;
  lineToMesh(&local_e0,(vec3 *)&local_184,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_1d8._0_4_ = (float)local_1d8._0_4_ - (float)local_208._0_4_;
  fVar1 = (float)local_138._0_4_ +
          (float)local_1f8._0_4_ + (float)local_1d8._0_4_ * (float)local_1d8._0_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_248._0_4_ * fVar1;
  local_258.field_1.y = (float)local_238._0_4_ * fVar1;
  local_258.field_0.x = (float)local_1d8._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_184,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = local_1c8._0_4_ - local_184.x;
  local_178._0_4_ = (float)local_178._0_4_ - local_180;
  fVar3 = local_1c0.z - local_17c.z;
  fVar4 = fVar3 * fVar3 + (float)local_178._0_4_ * (float)local_178._0_4_ + fVar1 * fVar1;
  local_158 = ZEXT416((uint)local_1c8._0_4_);
  local_20c.z = local_1c0.z;
  local_248 = ZEXT416((uint)local_184);
  local_228 = ZEXT416((uint)local_180);
  local_238._0_4_ = local_17c;
  if (fVar4 < 0.0) {
    local_1d8 = ZEXT416((uint)fVar1);
    local_1e8._0_4_ = fVar3;
    fVar4 = sqrtf(fVar4);
    fVar1 = (float)local_1d8._0_4_;
    fVar3 = (float)local_1e8._0_4_;
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  local_258.field_2.z = fVar3 * fVar4;
  local_258.field_1.y = (float)local_178._0_4_ * fVar4;
  local_258.field_0.x = fVar1 * fVar4;
  lineToMesh(&local_e0,(vec3 *)&local_184,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_1e8._0_4_ = local_190;
  fVar1 = local_168._0_4_ - local_190.x;
  local_1d8._0_4_ = local_18c;
  fVar4 = local_168._4_4_ - local_18c;
  local_178._0_4_ = local_188;
  fVar3 = local_160.z - local_188.z;
  fVar5 = fVar3 * fVar3 + fVar4 * fVar4 + fVar1 * fVar1;
  local_1b8 = ZEXT416((uint)local_168._0_4_);
  local_208 = ZEXT416((uint)local_168._4_4_);
  local_1f8._0_4_ = local_160;
  if (fVar5 < 0.0) {
    local_138 = ZEXT416((uint)fVar1);
    local_148._0_4_ = fVar3;
    local_f8 = ZEXT416((uint)fVar4);
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_138._0_4_;
    fVar3 = (float)local_148._0_4_;
    fVar4 = (float)local_f8._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar3 * fVar5;
  local_258.field_1.y = fVar4 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_190,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_248._0_4_ - (float)local_1e8._0_4_;
  fVar3 = (float)local_228._0_4_ - (float)local_1d8._0_4_;
  fVar4 = (float)local_238._0_4_ - (float)local_178._0_4_;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_248._0_4_ = fVar1;
    local_228._0_4_ = fVar3;
    local_238._0_4_ = fVar4;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_248._0_4_;
    fVar3 = (float)local_228._0_4_;
    fVar4 = (float)local_238._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar4 * fVar5;
  local_258.field_1.y = fVar3 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_190,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_138 = ZEXT416((uint)local_19c);
  fVar1 = local_19c.x - (float)local_1e8._0_4_;
  local_148 = ZEXT416((uint)local_198);
  fVar4 = local_198 - (float)local_1d8._0_4_;
  local_f8._0_4_ = local_194;
  fVar3 = local_194.z - (float)local_178._0_4_;
  fVar5 = fVar3 * fVar3 + fVar4 * fVar4 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_248 = ZEXT416((uint)fVar1);
    local_228._0_4_ = fVar3;
    local_238 = ZEXT416((uint)fVar4);
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_248._0_4_;
    fVar3 = (float)local_228._0_4_;
    fVar4 = (float)local_238._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar3 * fVar5;
  local_258.field_1.y = fVar4 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_190,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_248 = ZEXT416((uint)local_11c);
  local_1d8 = ZEXT416((uint)local_110);
  fVar3 = local_11c.x - local_110.x;
  local_228 = ZEXT416((uint)local_118);
  local_1e8 = ZEXT416((uint)local_10c);
  fVar4 = local_118 - local_10c;
  local_238._0_4_ = local_114;
  local_178._0_4_ = local_108;
  fVar1 = local_114.z - local_108.z;
  fVar5 = fVar1 * fVar1 + fVar4 * fVar4 + fVar3 * fVar3;
  if (fVar5 < 0.0) {
    local_38 = ZEXT416((uint)fVar3);
    local_28 = ZEXT416((uint)fVar4);
    local_1a0 = fVar1;
    fVar5 = sqrtf(fVar5);
    fVar1 = local_1a0;
    fVar3 = (float)local_38._0_4_;
    fVar4 = (float)local_28._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar1 * fVar5;
  local_258.field_1.y = fVar4 * fVar5;
  local_258.field_0.x = fVar3 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_110,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_1b8._0_4_ - (float)local_1d8._0_4_;
  fVar3 = (float)local_208._0_4_ - (float)local_1e8._0_4_;
  fVar4 = (float)local_1f8._0_4_ - (float)local_178._0_4_;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_1b8._0_4_ = fVar1;
    local_208._0_4_ = fVar3;
    local_1f8._0_4_ = fVar4;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_1b8._0_4_;
    fVar3 = (float)local_208._0_4_;
    fVar4 = (float)local_1f8._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar4 * fVar5;
  local_258.field_1.y = fVar3 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_110,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_138._0_4_ - (float)local_1d8._0_4_;
  fVar4 = (float)local_148._0_4_ - (float)local_1e8._0_4_;
  fVar3 = (float)local_f8._0_4_ - (float)local_178._0_4_;
  fVar5 = fVar3 * fVar3 + fVar4 * fVar4 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_1b8._4_4_ = local_138._4_4_;
    local_1b8._0_4_ = fVar1;
    local_1b8._8_4_ = local_138._8_4_;
    local_1b8._12_4_ = local_138._12_4_;
    local_208._0_4_ = fVar3;
    local_1f8._4_4_ = local_148._4_4_;
    local_1f8._0_4_ = fVar4;
    local_1f8._8_4_ = local_148._8_4_;
    local_1f8._12_4_ = local_148._12_4_;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_1b8._0_4_;
    fVar3 = (float)local_208._0_4_;
    fVar4 = (float)local_1f8._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar3 * fVar5;
  local_258.field_1.y = fVar4 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_110,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_158._0_4_ - (float)local_248._0_4_;
  local_1b8 = ZEXT416((uint)local_1c8._4_4_);
  fVar3 = local_1c8._4_4_ - (float)local_228._0_4_;
  aVar6.z = local_20c.z - (float)local_238._0_4_;
  fVar4 = aVar6.z * aVar6.z + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar4 < 0.0) {
    local_158._0_4_ = fVar1;
    local_208 = ZEXT416((uint)fVar3);
    local_20c.z = aVar6.z;
    fVar4 = sqrtf(fVar4);
    fVar1 = (float)local_158._0_4_;
    aVar6 = local_20c;
    fVar3 = (float)local_208._0_4_;
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  local_258.field_2.z = aVar6.z * fVar4;
  local_258.field_1.y = fVar3 * fVar4;
  local_258.field_0.x = fVar1 * fVar4;
  lineToMesh(&local_e0,(vec3 *)&local_11c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = (float)local_1d8._0_4_ - (float)local_248._0_4_;
  fVar4 = (float)local_1e8._0_4_ - (float)local_228._0_4_;
  fVar3 = (float)local_178._0_4_ - (float)local_238._0_4_;
  fVar5 = fVar3 * fVar3 + fVar4 * fVar4 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_208._4_4_ = local_1d8._4_4_;
    local_208._0_4_ = fVar1;
    local_208._8_4_ = local_1d8._8_4_;
    local_208._12_4_ = local_1d8._12_4_;
    local_1f8._0_4_ = fVar3;
    local_158._4_4_ = local_1e8._4_4_;
    local_158._0_4_ = fVar4;
    local_158._8_4_ = local_1e8._8_4_;
    local_158._12_4_ = local_1e8._12_4_;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_208._0_4_;
    fVar3 = (float)local_1f8._0_4_;
    fVar4 = (float)local_158._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar3 * fVar5;
  local_258.field_1.y = fVar4 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_11c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = local_104.x - (float)local_248._0_4_;
  fVar3 = local_100 - (float)local_228._0_4_;
  fVar4 = local_fc.z - (float)local_238._0_4_;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_208 = ZEXT416((uint)fVar1);
    local_1f8 = ZEXT416((uint)fVar3);
    local_158._0_4_ = fVar4;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_208._0_4_;
    fVar3 = (float)local_1f8._0_4_;
    fVar4 = (float)local_158._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar4 * fVar5;
  local_258.field_1.y = fVar3 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_11c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_208 = ZEXT416((uint)local_1c8._0_4_);
  local_138._0_4_ = (float)local_138._0_4_ - local_1c8._0_4_;
  local_148._0_4_ = (float)local_148._0_4_ - (float)local_1b8._0_4_;
  local_1f8._0_4_ = local_1c0;
  fVar1 = (float)local_f8._0_4_ - local_1c0.z;
  local_f8._0_4_ = fVar1;
  fVar1 = fVar1 * fVar1 +
          (float)local_148._0_4_ * (float)local_148._0_4_ +
          (float)local_138._0_4_ * (float)local_138._0_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_f8._0_4_ * fVar1;
  local_258.field_1.y = (float)local_148._0_4_ * fVar1;
  local_258.field_0.x = (float)local_138._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_1c8,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_248._0_4_ = (float)local_248._0_4_ - (float)local_208._0_4_;
  local_228._0_4_ = (float)local_228._0_4_ - (float)local_1b8._0_4_;
  fVar3 = (float)local_238._0_4_ - (float)local_1f8._0_4_;
  fVar1 = fVar3 * fVar3 +
          (float)local_228._0_4_ * (float)local_228._0_4_ +
          (float)local_248._0_4_ * (float)local_248._0_4_;
  local_238._0_4_ = fVar3;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_238._0_4_ * fVar1;
  local_258.field_1.y = (float)local_228._0_4_ * fVar1;
  local_258.field_0.x = (float)local_248._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_1c8,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = local_184.x - (float)local_208._0_4_;
  fVar3 = local_180 - (float)local_1b8._0_4_;
  fVar4 = local_17c.z - (float)local_1f8._0_4_;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_248 = ZEXT416((uint)fVar1);
    local_228 = ZEXT416((uint)fVar3);
    local_238._0_4_ = fVar4;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_248._0_4_;
    fVar3 = (float)local_228._0_4_;
    fVar4 = (float)local_238._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar4 * fVar5;
  local_258.field_1.y = fVar3 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_1c8,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_228._0_4_ = local_19c;
  local_1d8._0_4_ = (float)local_1d8._0_4_ - local_19c.x;
  local_248._0_4_ = local_198;
  local_1e8._0_4_ = (float)local_1e8._0_4_ - local_198;
  local_238._0_4_ = local_194;
  fVar1 = (float)local_178._0_4_ - local_194.z;
  local_178._0_4_ = fVar1;
  fVar1 = fVar1 * fVar1 +
          (float)local_1e8._0_4_ * (float)local_1e8._0_4_ +
          (float)local_1d8._0_4_ * (float)local_1d8._0_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_178._0_4_ * fVar1;
  local_258.field_1.y = (float)local_1e8._0_4_ * fVar1;
  local_258.field_0.x = (float)local_1d8._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_19c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  local_208._0_4_ = (float)local_208._0_4_ - (float)local_228._0_4_;
  local_1b8._0_4_ = (float)local_1b8._0_4_ - (float)local_248._0_4_;
  fVar1 = (float)local_1f8._0_4_ - (float)local_238._0_4_;
  local_1f8._0_4_ = fVar1;
  fVar1 = fVar1 * fVar1 +
          (float)local_1b8._0_4_ * (float)local_1b8._0_4_ +
          (float)local_208._0_4_ * (float)local_208._0_4_;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_258.field_2.z = (float)local_1f8._0_4_ * fVar1;
  local_258.field_1.y = (float)local_1b8._0_4_ * fVar1;
  local_258.field_0.x = (float)local_208._0_4_ * fVar1;
  lineToMesh(&local_e0,(vec3 *)&local_19c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  fVar1 = local_190.x - (float)local_228._0_4_;
  fVar3 = local_18c - (float)local_248._0_4_;
  fVar4 = local_188.z - (float)local_238._0_4_;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    local_248 = ZEXT416((uint)fVar1);
    local_228 = ZEXT416((uint)fVar3);
    local_238._0_4_ = fVar4;
    fVar5 = sqrtf(fVar5);
    fVar1 = (float)local_248._0_4_;
    fVar3 = (float)local_228._0_4_;
    fVar4 = (float)local_238._0_4_;
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  local_258.field_2.z = fVar4 * fVar5;
  local_258.field_1.y = fVar3 * fVar5;
  local_258.field_0.x = fVar1 * fVar5;
  lineToMesh(&local_e0,(vec3 *)&local_19c,&local_258,fVar2);
  Mesh::append(__return_storage_ptr__,&local_e0);
  Mesh::~Mesh(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Mesh cubeCornersMesh(const glm::vec3 &_min_v, const glm::vec3 &_max_v, float _size) {
    float size = glm::min(glm::length(_min_v), glm::length(_max_v)) * _size *  0.5;

    //    D ---- A
    // C ---- B  |
    // |  |   |  |
    // |  I --|- F
    // H .... G

    glm::vec3 A = _max_v;
    glm::vec3 H = _min_v;

    glm::vec3 B = glm::vec3(A.x, A.y, H.z);
    glm::vec3 C = glm::vec3(H.x, A.y, H.z);
    glm::vec3 D = glm::vec3(H.x, A.y, A.z);

    glm::vec3 F = glm::vec3(A.x, H.y, A.z);
    glm::vec3 G = glm::vec3(A.x, H.y, H.z);
    glm::vec3 I = glm::vec3(H.x, H.y, A.z);

    Mesh mesh;
    mesh.setDrawMode(LINES);
    mesh.append( lineToMesh(A, normalize(D-A), size) );
    mesh.append( lineToMesh(A, normalize(B-A), size) );
    mesh.append( lineToMesh(A, normalize(F-A), size) );

    mesh.append( lineToMesh(B, normalize(A-B), size) );
    mesh.append( lineToMesh(B, normalize(C-B), size) );
    mesh.append( lineToMesh(B, normalize(G-B), size) );

    mesh.append( lineToMesh(C, normalize(D-C), size) );
    mesh.append( lineToMesh(C, normalize(B-C), size) );
    mesh.append( lineToMesh(C, normalize(H-C), size) );
    
    mesh.append( lineToMesh(D, normalize(A-D), size) );
    mesh.append( lineToMesh(D, normalize(C-D), size) );
    mesh.append( lineToMesh(D, normalize(I-D), size) );

    mesh.append( lineToMesh(F, normalize(G-F), size) );
    mesh.append( lineToMesh(F, normalize(A-F), size) );
    mesh.append( lineToMesh(F, normalize(I-F), size) );

    mesh.append( lineToMesh(G, normalize(H-G), size) );
    mesh.append( lineToMesh(G, normalize(F-G), size) );
    mesh.append( lineToMesh(G, normalize(B-G), size) );

    mesh.append( lineToMesh(H, normalize(I-H), size) );
    mesh.append( lineToMesh(H, normalize(G-H), size) );
    mesh.append( lineToMesh(H, normalize(C-H), size) );

    mesh.append( lineToMesh(I, normalize(F-I), size) );
    mesh.append( lineToMesh(I, normalize(H-I), size) );
    mesh.append( lineToMesh(I, normalize(D-I), size) );

    return mesh;
}